

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O1

bool __thiscall
cmRuntimeDependencyArchive::GetRuntimeDependencies
          (cmRuntimeDependencyArchive *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *executables,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libraries,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *modules)

{
  pointer pbVar1;
  cmBinUtilsLinker *pcVar2;
  char cVar3;
  int iVar4;
  pointer pbVar5;
  bool bVar6;
  
  pbVar5 = (executables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (executables->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pbVar5 == pbVar1;
  if (bVar6) {
LAB_003a469e:
    pbVar5 = (libraries->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (libraries->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = pbVar5 == pbVar1;
    if (!bVar6) {
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,2);
      cVar3 = (char)iVar4;
      while (cVar3 != '\0') {
        pbVar5 = pbVar5 + 1;
        bVar6 = pbVar5 == pbVar1;
        if (bVar6) goto LAB_003a46f0;
        pcVar2 = (this->Linker)._M_t.
                 super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
                 super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
        iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,2);
        cVar3 = (char)iVar4;
      }
      if (!bVar6) goto LAB_003a473f;
    }
LAB_003a46f0:
    pbVar5 = (modules->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (modules->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = pbVar5 == pbVar1;
    if (!bVar6) {
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,3);
      cVar3 = (char)iVar4;
      while (cVar3 != '\0') {
        pbVar5 = pbVar5 + 1;
        bVar6 = pbVar5 == pbVar1;
        if (bVar6) {
          return bVar6;
        }
        pcVar2 = (this->Linker)._M_t.
                 super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
                 super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
        iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,3);
        cVar3 = (char)iVar4;
      }
    }
  }
  else {
    pcVar2 = (this->Linker)._M_t.
             super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
             super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
    iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,0);
    cVar3 = (char)iVar4;
    while (cVar3 != '\0') {
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 == pbVar1;
      if (bVar6) goto LAB_003a469e;
      pcVar2 = (this->Linker)._M_t.
               super___uniq_ptr_impl<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>._M_t.
               super__Tuple_impl<0UL,_cmBinUtilsLinker_*,_std::default_delete<cmBinUtilsLinker>_>.
               super__Head_base<0UL,_cmBinUtilsLinker_*,_false>._M_head_impl;
      iVar4 = (*pcVar2->_vptr_cmBinUtilsLinker[3])(pcVar2,pbVar5,0);
      cVar3 = (char)iVar4;
    }
    if (bVar6) goto LAB_003a469e;
LAB_003a473f:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool cmRuntimeDependencyArchive::GetRuntimeDependencies(
  const std::vector<std::string>& executables,
  const std::vector<std::string>& libraries,
  const std::vector<std::string>& modules)
{
  for (auto const& exe : executables) {
    if (!this->Linker->ScanDependencies(exe, cmStateEnums::EXECUTABLE)) {
      return false;
    }
  }
  for (auto const& lib : libraries) {
    if (!this->Linker->ScanDependencies(lib, cmStateEnums::SHARED_LIBRARY)) {
      return false;
    }
  }
  for (auto const& mod : modules) {
    if (!this->Linker->ScanDependencies(mod, cmStateEnums::MODULE_LIBRARY)) {
      return false;
    }
  }

  return true;
}